

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

Joint * __thiscall
CMU462::DynamicScene::Skeleton::loadJoint
          (Skeleton *this,XMLElement *jointNode,
          set<double,_std::less<double>,_std::allocator<double>_> *knotTimes)

{
  ostream *this_00;
  Joint *pJVar1;
  XMLElement *in_RDX;
  Skeleton *in_RSI;
  double dVar2;
  pair<std::_Rb_tree_const_iterator<double>,_bool> pVar3;
  Joint *childJoint;
  XMLElement *pChild;
  Vector3D scale;
  double z_2;
  double y_2;
  double x_2;
  double time_2;
  Vector3D rotation;
  double z_1;
  double y_1;
  double x_1;
  double time_1;
  Vector3D position;
  double z;
  double y;
  double x;
  double time;
  XMLElement *pListElement;
  XMLElement *pElement;
  Joint *joint;
  Spline<CMU462::Vector3D> *in_stack_fffffffffffffe48;
  XMLElement *in_stack_fffffffffffffe50;
  Spline<CMU462::Vector3D> *in_stack_fffffffffffffe58;
  Spline<CMU462::Vector3D> *in_stack_fffffffffffffe60;
  Spline<CMU462::Vector3D> *in_stack_fffffffffffffe68;
  set<double,_std::less<double>,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  XMLElement *local_170;
  Skeleton *in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea1;
  Vector3D local_158;
  Vector3D local_140;
  double local_128;
  double local_120;
  double local_118;
  XMLElement *local_110;
  _Base_ptr local_108;
  undefined1 local_100;
  Vector3D local_f8;
  Vector3D local_e0;
  double local_c8;
  double local_c0;
  double local_b8;
  Spline<CMU462::Vector3D> *local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  Vector3D local_98;
  Vector3D local_80;
  double local_68;
  double local_60;
  double local_58;
  set<double,_std::less<double>,_std::allocator<double>_> *local_50;
  XMLElement *local_48;
  XMLElement *local_40;
  Joint *local_8;
  
  if (in_RSI == (Skeleton *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Invalid joint node");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_8 = (Joint *)0x0;
  }
  else {
    local_8 = (Joint *)operator_new(0x168);
    Joint::Joint((Joint *)CONCAT71(in_stack_fffffffffffffea1,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
    local_40 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    dVar2 = tinyxml2::XMLElement::DoubleAttribute
                      (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    (local_8->axis).x = dVar2;
    dVar2 = tinyxml2::XMLElement::DoubleAttribute
                      (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    (local_8->axis).y = dVar2;
    dVar2 = tinyxml2::XMLElement::DoubleAttribute
                      (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    (local_8->axis).z = dVar2;
    local_40 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    dVar2 = tinyxml2::XMLElement::DoubleAttribute
                      (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    local_8->renderScale = dVar2;
    local_40 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    dVar2 = tinyxml2::XMLElement::DoubleAttribute
                      (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    local_8->capsuleRadius = dVar2;
    local_40 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    local_48 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    while (local_48 != (XMLElement *)0x0) {
      local_50 = (set<double,_std::less<double>,_std::allocator<double>_> *)
                 tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_58 = tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_60 = tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_68 = tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      Vector3D::Vector3D(&local_80,local_58,local_60,local_68);
      in_stack_fffffffffffffe68 = &(local_8->super_SceneObject).positions;
      in_stack_fffffffffffffe70 = local_50;
      Vector3D::Vector3D(&local_98,&local_80);
      Spline<CMU462::Vector3D>::setValue
                (in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58,
                 (Vector3D *)in_stack_fffffffffffffe50);
      pVar3 = std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                        (in_stack_fffffffffffffe70,(value_type_conflict4 *)in_stack_fffffffffffffe68
                        );
      local_a8 = (_Base_ptr)pVar3.first._M_node;
      local_a0 = pVar3.second;
      local_48 = tinyxml2::XMLNode::NextSiblingElement
                           (&in_stack_fffffffffffffe50->super_XMLNode,
                            (char *)in_stack_fffffffffffffe48);
    }
    local_40 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    local_48 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    while (local_48 != (XMLElement *)0x0) {
      local_b0 = (Spline<CMU462::Vector3D> *)
                 tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_b8 = tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_c0 = tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_c8 = tinyxml2::XMLElement::DoubleAttribute
                           (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      Vector3D::Vector3D(&local_e0,local_b8,local_c0,local_c8);
      in_stack_fffffffffffffe58 = &(local_8->super_SceneObject).rotations;
      in_stack_fffffffffffffe60 = local_b0;
      Vector3D::Vector3D(&local_f8,&local_e0);
      Spline<CMU462::Vector3D>::setValue
                (in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58,
                 (Vector3D *)in_stack_fffffffffffffe50);
      pVar3 = std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                        (in_stack_fffffffffffffe70,(value_type_conflict4 *)in_stack_fffffffffffffe68
                        );
      local_108 = (_Base_ptr)pVar3.first._M_node;
      local_100 = pVar3.second;
      local_48 = tinyxml2::XMLNode::NextSiblingElement
                           (&in_stack_fffffffffffffe50->super_XMLNode,
                            (char *)in_stack_fffffffffffffe48);
    }
    local_40 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    local_48 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    while (local_48 != (XMLElement *)0x0) {
      local_110 = (XMLElement *)
                  tinyxml2::XMLElement::DoubleAttribute
                            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_118 = tinyxml2::XMLElement::DoubleAttribute
                            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_120 = tinyxml2::XMLElement::DoubleAttribute
                            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_128 = tinyxml2::XMLElement::DoubleAttribute
                            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      Vector3D::Vector3D(&local_140,local_118,local_120,local_128);
      in_stack_fffffffffffffe48 = &(local_8->super_SceneObject).scales;
      in_stack_fffffffffffffe50 = local_110;
      Vector3D::Vector3D(&local_158,&local_140);
      Spline<CMU462::Vector3D>::setValue
                (in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58,
                 (Vector3D *)in_stack_fffffffffffffe50);
      std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                (in_stack_fffffffffffffe70,(value_type_conflict4 *)in_stack_fffffffffffffe68);
      local_48 = tinyxml2::XMLNode::NextSiblingElement
                           (&in_stack_fffffffffffffe50->super_XMLNode,
                            (char *)in_stack_fffffffffffffe48);
    }
    local_40 = tinyxml2::XMLNode::FirstChildElement
                         (&in_stack_fffffffffffffe50->super_XMLNode,
                          (char *)in_stack_fffffffffffffe48);
    local_170 = tinyxml2::XMLNode::FirstChildElement
                          (&in_stack_fffffffffffffe50->super_XMLNode,
                           (char *)in_stack_fffffffffffffe48);
    while (local_170 != (XMLElement *)0x0) {
      pJVar1 = loadJoint(in_RSI,in_RDX,
                         (set<double,_std::less<double>,_std::allocator<double>_> *)local_8);
      pJVar1->parent = local_8;
      std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
      push_back((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                 *)in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
      local_170 = tinyxml2::XMLNode::NextSiblingElement
                            (&in_stack_fffffffffffffe50->super_XMLNode,
                             (char *)in_stack_fffffffffffffe48);
    }
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    push_back((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               *)in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
  }
  return local_8;
}

Assistant:

Joint* CMU462::DynamicScene::Skeleton::loadJoint(XMLElement* jointNode,
                                                 set<double>& knotTimes) {
  if (jointNode == nullptr) {
    cout << "Invalid joint node" << endl;
    return nullptr;
  }
  Joint* joint = new Joint(this);

  XMLElement* pElement = jointNode->FirstChildElement("Axis");
  joint->axis.x = pElement->DoubleAttribute("x");
  joint->axis.y = pElement->DoubleAttribute("y");
  joint->axis.z = pElement->DoubleAttribute("z");

  pElement = jointNode->FirstChildElement("RenderScale");
  joint->renderScale = pElement->DoubleAttribute("val");

  pElement = jointNode->FirstChildElement("CapsuleRadius");
  joint->capsuleRadius = pElement->DoubleAttribute("val");

  // positions
  pElement = jointNode->FirstChildElement("Positions");
  XMLElement* pListElement = pElement->FirstChildElement("Knot");
  while (pListElement != nullptr) {
    double time = pListElement->DoubleAttribute("Time");
    double x = pListElement->DoubleAttribute("x");
    double y = pListElement->DoubleAttribute("y");
    double z = pListElement->DoubleAttribute("z");
    Vector3D position(x, y, z);

    joint->positions.setValue(time, position);
    knotTimes.insert(time);
    pListElement = pListElement->NextSiblingElement("Knot");
  }

  // rotations
  pElement = jointNode->FirstChildElement("Rotations");
  pListElement = pElement->FirstChildElement("Knot");
  while (pListElement != nullptr) {
    double time = pListElement->DoubleAttribute("Time");
    double x = pListElement->DoubleAttribute("x");
    double y = pListElement->DoubleAttribute("y");
    double z = pListElement->DoubleAttribute("z");
    Vector3D rotation(x, y, z);

    joint->rotations.setValue(time, rotation);
    knotTimes.insert(time);
    pListElement = pListElement->NextSiblingElement("Knot");
  }

  // scales
  pElement = jointNode->FirstChildElement("Scales");
  pListElement = pElement->FirstChildElement("Knot");
  while (pListElement != nullptr) {
    double time = pListElement->DoubleAttribute("Time");
    double x = pListElement->DoubleAttribute("x");
    double y = pListElement->DoubleAttribute("y");
    double z = pListElement->DoubleAttribute("z");
    Vector3D scale(x, y, z);

    joint->scales.setValue(time, scale);
    knotTimes.insert(time);
    pListElement = pListElement->NextSiblingElement("Knot");
  }

  pElement = jointNode->FirstChildElement("Children");
  XMLElement* pChild = pElement->FirstChildElement("Joint");
  while (pChild != nullptr) {
    Joint* childJoint = loadJoint(pChild, knotTimes);
    childJoint->parent = joint;
    joint->kids.push_back(childJoint);
    pChild = pChild->NextSiblingElement("Joint");
  }

  joints.push_back(joint);

  return joint;
}